

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O3

ostream * operator<<(ostream *os,ResultValue value)

{
  long *local_50;
  char *local_48;
  long local_40 [2];
  double local_30;
  double local_28;
  undefined8 uStack_20;
  
  switch(value.mType) {
  case NONE:
    std::__ostream_insert<char,std::char_traits<char>>(os,"NONE",4);
    break;
  case FLOAT:
    value.mComplexValue._M_value._0_8_ = value.mFloatValue;
    goto LAB_0012642c;
  case INTEGER:
    std::ostream::_M_insert<long>((long)os);
    break;
  case COMPLEX:
    local_28 = ABS((double)value.mComplexValue._M_value._8_8_);
    uStack_20 = 0;
    if (1e-10 < local_28) {
      local_30 = (double)value.mComplexValue._M_value._0_8_;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"+","");
      if ((double)value.mComplexValue._M_value._8_8_ < 0.0) {
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x139a07);
      }
      if ((local_30 != 0.0) || (NAN(local_30))) {
        std::ostream::_M_insert<double>(local_30);
      }
      else {
        std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x139a07);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,(long)local_48);
      if ((local_28 != 1.0) || (NAN(local_28))) {
        std::ostream::_M_insert<double>((double)value.mComplexValue._M_value._8_8_);
      }
      if (((double)value.mComplexValue._M_value._8_8_ == -1.0) &&
         (!NAN((double)value.mComplexValue._M_value._8_8_))) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"-",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"i",1);
      if (local_50 == local_40) {
        return os;
      }
      operator_delete(local_50,local_40[0] + 1);
      return os;
    }
LAB_0012642c:
    std::ostream::_M_insert<double>((double)value.mComplexValue._M_value._0_8_);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ResultValue value) {
	switch (value.type()) {
		case ResultValueType::NONE:
			os << "NONE";
			break;
		case ResultValueType::FLOAT:
			os << value.floatValue();
			break;
		case ResultValueType::INTEGER:
			os << value.intValue();
			break;
		case ResultValueType::COMPLEX:
			if (std::abs(value.complexValue().imag()) <= EPSILON) {
				os << value.complexValue().real();
			} else {
				std::string sign = "+";
				if (value.complexValue().imag() < 0) {
					sign = "";
				}

				if (value.complexValue().real() != 0) {
					os << value.complexValue().real();
				} else {
					sign = "";
				}

				os << sign;

				if (std::abs(value.complexValue().imag()) != 1) {
					os << value.complexValue().imag();
				}

				if (value.complexValue().imag() == -1) {
					os << "-";
				}

				os << "i";
			}
			break;
	}

	return os;
}